

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,String *rest_3,
          ArrayPtr<const_char> *rest_4,CappedArray<char,_14UL> *rest_5,ArrayPtr<const_char> *rest_6)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  Branch *pBVar3;
  char *pcVar4;
  ArrayDisposer *pAVar5;
  Branch *pBVar6;
  char *pcVar7;
  size_t sVar8;
  
  pcVar7 = (char *)(this->text).content.size_;
  if (pcVar7 != (char *)0x0) {
    pcVar7 = (this->text).content.ptr;
  }
  (this->branches).ptr[branchIndex].index = (long)pos - (long)pcVar7;
  sVar1 = (first->content).size_;
  sVar8 = 0;
  if (sVar1 != 0) {
    sVar8 = sVar1 - 1;
  }
  pcVar7 = (first->content).ptr;
  pAVar2 = (first->content).disposer;
  (first->content).ptr = (char *)0x0;
  (first->content).size_ = 0;
  pBVar3 = (this->branches).ptr;
  pBVar3[branchIndex].content.size_ = sVar8;
  pcVar4 = pBVar3[branchIndex].content.text.content.ptr;
  if (pcVar4 != (char *)0x0) {
    sVar8 = pBVar3[branchIndex].content.text.content.size_;
    pBVar3[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar3[branchIndex].content.text.content.size_ = 0;
    pAVar5 = pBVar3[branchIndex].content.text.content.disposer;
    (**pAVar5->_vptr_ArrayDisposer)(pAVar5,pcVar4,1,sVar8,sVar8,0);
  }
  pBVar3[branchIndex].content.text.content.ptr = pcVar7;
  pBVar3[branchIndex].content.text.content.size_ = sVar1;
  pBVar3[branchIndex].content.text.content.disposer = pAVar2;
  pBVar6 = pBVar3[branchIndex].content.branches.ptr;
  if (pBVar6 != (Branch *)0x0) {
    sVar1 = pBVar3[branchIndex].content.branches.size_;
    pBVar3[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar3[branchIndex].content.branches.size_ = 0;
    pAVar2 = pBVar3[branchIndex].content.branches.disposer;
    (**pAVar2->_vptr_ArrayDisposer)
              (pAVar2,pBVar6,0x40,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  pBVar3[branchIndex].content.branches.ptr = (Branch *)0x0;
  pBVar3[branchIndex].content.branches.size_ = 0;
  pBVar3[branchIndex].content.branches.disposer = (ArrayDisposer *)0x0;
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}